

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::TransformPromiseNodeBase::tracePromise
          (TransformPromiseNodeBase *this,TraceBuilder *builder,bool stopAtNextEvent)

{
  PromiseNode *pPVar1;
  bool stopAtNextEvent_local;
  TraceBuilder *builder_local;
  TransformPromiseNodeBase *this_local;
  
  pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::get(&this->dependency);
  if (pPVar1 != (PromiseNode *)0x0) {
    pPVar1 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&this->dependency);
    (*(pPVar1->super_PromiseArenaMember)._vptr_PromiseArenaMember[4])
              (pPVar1,builder,(ulong)stopAtNextEvent);
  }
  TraceBuilder::add(builder,this->continuationTracePtr);
  return;
}

Assistant:

void TransformPromiseNodeBase::tracePromise(TraceBuilder& builder, bool stopAtNextEvent) {
  // Note that we null out the dependency just before calling our own continuation, which
  // conveniently means that if we're currently executing the continuation when the trace is
  // requested, it won't trace into the obsolete dependency. Nice.
  if (dependency.get() != nullptr) {
    dependency->tracePromise(builder, stopAtNextEvent);
  }

  builder.add(continuationTracePtr);
}